

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesPrepare(Fra_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  long lVar1;
  uint p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__s;
  Aig_Obj_t **ppNexts_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t **ppAVar7;
  int iEntry;
  int nNodes;
  int nEntries;
  int nTableSize;
  int k;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppNexts;
  Aig_Obj_t **ppTable;
  int nMaxLevs_local;
  int fLatchCorr_local;
  Fra_Cla_t *p_local;
  
  p_00 = Aig_ManObjNumMax(p->pAig);
  iVar2 = Abc_PrimeCudd(p_00);
  __s = malloc((long)iVar2 << 3);
  memset(__s,0xff,(long)iVar2 << 3);
  ppNexts_00 = (Aig_Obj_t **)malloc((long)iVar2 << 3);
  memset(ppNexts_00,0xff,(long)iVar2 << 3);
  memset(__s,0,(long)iVar2 << 3);
  Vec_PtrClear(p->vClasses1);
  nTableSize = 0;
  do {
    iVar3 = Vec_PtrSize(p->pAig->vObjs);
    if (iVar3 <= nTableSize) {
      iEntry = 0;
      for (nTableSize = 0; nTableSize < iVar2; nTableSize = nTableSize + 1) {
        if ((*(long *)((long)__s + (long)nTableSize * 8) != 0) &&
           (pAVar5 = *(Aig_Obj_t **)((long)__s + (long)nTableSize * 8),
           pAVar6 = Fra_ObjNext(ppNexts_00,*(Aig_Obj_t **)((long)__s + (long)nTableSize * 8)),
           pAVar5 != pAVar6)) {
          _k = Fra_ObjNext(ppNexts_00,*(Aig_Obj_t **)((long)__s + (long)nTableSize * 8));
          nEntries = 1;
          while (_k != *(Aig_Obj_t **)((long)__s + (long)nTableSize * 8)) {
            _k = Fra_ObjNext(ppNexts_00,_k);
            nEntries = nEntries + 1;
          }
          if (nEntries < 2) {
            __assert_fail("k > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                          ,0x150,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
          }
          iEntry = nEntries + iEntry;
          if ((*(ulong *)(*(long *)((long)__s + (long)nTableSize * 8) + 0x18) >> 4 & 1) != 0) {
            __assert_fail("ppTable[i]->fMarkA == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                          ,0x153,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
          }
          lVar1 = *(long *)((long)__s + (long)nTableSize * 8);
          *(ulong *)(lVar1 + 0x18) = *(ulong *)(lVar1 + 0x18) & 0xffffffffffffffef | 0x10;
        }
      }
      iVar2 = Vec_PtrSize(p->vClasses1);
      ppAVar7 = (Aig_Obj_t **)malloc((long)((iEntry + iVar2) * 2) << 3);
      p->pMemClasses = ppAVar7;
      p->pMemClassesFree = p->pMemClasses + (iEntry << 1);
      Vec_PtrClear(p->vClasses);
      iEntry = 0;
      nTableSize = 0;
      do {
        iVar2 = Vec_PtrSize(p->pAig->vObjs);
        if (iVar2 <= nTableSize) {
          if (__s != (void *)0x0) {
            free(__s);
          }
          if (ppNexts_00 != (Aig_Obj_t **)0x0) {
            free(ppNexts_00);
          }
          Fra_ClassesRefine(p);
          return;
        }
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTableSize);
        if ((pAVar5 != (Aig_Obj_t *)0x0) &&
           (((iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0 || (iVar2 = Aig_ObjIsCi(pAVar5), iVar2 != 0)
             ) && ((*(ulong *)&pAVar5->field_0x18 >> 4 & 1) != 0)))) {
          *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef;
          Vec_PtrPush(p->vClasses,p->pMemClasses + (iEntry << 1));
          _k = Fra_ObjNext(ppNexts_00,pAVar5);
          nEntries = 1;
          while (iVar2 = nEntries, _k != pAVar5) {
            _k = Fra_ObjNext(ppNexts_00,_k);
            nEntries = nEntries + 1;
          }
          if (nEntries < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                          ,0x16d,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
          }
          p->pMemClasses[iEntry << 1] = pAVar5;
          _k = Fra_ObjNext(ppNexts_00,pAVar5);
          nEntries = 1;
          while (_k != pAVar5) {
            p->pMemClasses[(iEntry * 2 + iVar2) - nEntries] = _k;
            Fra_ClassObjSetRepr(_k,pAVar5);
            _k = Fra_ObjNext(ppNexts_00,_k);
            nEntries = nEntries + 1;
          }
          p->pMemClasses[iEntry * 2 + iVar2] = (Aig_Obj_t *)0x0;
          iEntry = nEntries + iEntry;
        }
        nTableSize = nTableSize + 1;
      } while( true );
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nTableSize);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      if (fLatchCorr == 0) {
        iVar3 = Aig_ObjIsNode(pAVar5);
        if (((iVar3 != 0) || (iVar3 = Aig_ObjIsCi(pAVar5), iVar3 != 0)) &&
           ((nMaxLevs == 0 ||
            ((int)((uint)((ulong)*(undefined8 *)&pAVar5->field_0x18 >> 0x20) & 0xffffff) <= nMaxLevs
            )))) goto LAB_007ce2f6;
      }
      else {
        iVar3 = Aig_ObjIsCi(pAVar5);
        if (iVar3 != 0) {
LAB_007ce2f6:
          iVar3 = (*p->pFuncNodeHash)(pAVar5,iVar2);
          iVar4 = (*p->pFuncNodeIsConst)(pAVar5);
          if (iVar4 == 0) {
            if (*(long *)((long)__s + (long)iVar3 * 8) == 0) {
              *(Aig_Obj_t **)((long)__s + (long)iVar3 * 8) = pAVar5;
              Fra_ObjSetNext(ppNexts_00,pAVar5,pAVar5);
            }
            else {
              pAVar6 = Fra_ObjNext(ppNexts_00,*(Aig_Obj_t **)((long)__s + (long)iVar3 * 8));
              Fra_ObjSetNext(ppNexts_00,pAVar5,pAVar6);
              Fra_ObjSetNext(ppNexts_00,*(Aig_Obj_t **)((long)__s + (long)iVar3 * 8),pAVar5);
            }
          }
          else {
            Vec_PtrPush(p->vClasses1,pAVar5);
            pAVar6 = Aig_ManConst1(p->pAig);
            Fra_ClassObjSetRepr(pAVar5,pAVar6);
          }
        }
      }
    }
    nTableSize = nTableSize + 1;
  } while( true );
}

Assistant:

void Fra_ClassesPrepare( Fra_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts;
    Aig_Obj_t * pObj, * pTemp;
    int i, k, nTableSize, nEntries, nNodes, iEntry;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig) );
    ppTable = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    memset( ppTable, 0, sizeof(Aig_Obj_t *) * nTableSize );

    // add all the nodes to the hash table
    Vec_PtrClear( p->vClasses1 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( pObj, nTableSize );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( pObj ) )
        {
            Vec_PtrPush( p->vClasses1, pObj );
            Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pAig) );
            continue;
        }
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
            Fra_ObjSetNext( ppNexts, pObj, pObj );
        }
        else
        {
            Fra_ObjSetNext( ppNexts, pObj, Fra_ObjNext(ppNexts,ppTable[iEntry]) );
            Fra_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
        }
    }

    // count the total number of nodes in the non-trivial classes
    // mark the representative nodes of each equivalence class
    nEntries = 0;
    for ( i = 0; i < nTableSize; i++ )
        if ( ppTable[i] && ppTable[i] != Fra_ObjNext(ppNexts, ppTable[i]) )
        {
            for ( pTemp = Fra_ObjNext(ppNexts, ppTable[i]), k = 1; 
                  pTemp != ppTable[i]; 
                  pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
            assert( k > 1 );
            nEntries += k;
            // mark the node
            assert( ppTable[i]->fMarkA == 0 );
            ppTable[i]->fMarkA = 1;
        }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->vClasses1)) );
    p->pMemClassesFree = p->pMemClasses + 2*nEntries;
 
    // copy the entries into storage in the topological order
    Vec_PtrClear( p->vClasses );
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        // skip the nodes that are not representatives of non-trivial classes
        if ( pObj->fMarkA == 0 )
            continue;
        pObj->fMarkA = 0;
        // add the class of nodes
        Vec_PtrPush( p->vClasses, p->pMemClasses + 2*nEntries );
        // count the number of entries in this class
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
        nNodes = k;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        p->pMemClasses[2*nEntries] = pObj;
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ )
        {
            p->pMemClasses[2*nEntries+nNodes-k] = pTemp;
            Fra_ClassObjSetRepr( pTemp, pObj );
        }
        // add as many empty entries
        p->pMemClasses[2*nEntries + nNodes] = NULL;
        // increment the number of entries
        nEntries += k;
    }
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Fra_ClassesRefine( p );
//    Fra_ClassesPrint( p, 0 );
}